

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void google::protobuf::internal::MapFieldBase::SwapPayload(MapFieldBase *lhs,MapFieldBase *rhs)

{
  undefined1 uVar1;
  State SVar2;
  TaggedPtr TVar3;
  Arena *pAVar4;
  Arena *pAVar5;
  ReflectionPayload *this;
  ReflectionPayload *other;
  long lVar6;
  
  pAVar4 = arena(lhs);
  pAVar5 = arena(rhs);
  if (pAVar4 == pAVar5) {
    TVar3 = (rhs->super_MapFieldBaseForParse).payload_._M_i;
    (rhs->super_MapFieldBaseForParse).payload_._M_i =
         (lhs->super_MapFieldBaseForParse).payload_._M_i;
    (lhs->super_MapFieldBaseForParse).payload_._M_i = TVar3;
  }
  else {
    TVar3 = (lhs->super_MapFieldBaseForParse).payload_._M_i;
    if ((TVar3 & 1) == 0) {
      this = (ReflectionPayload *)0x0;
    }
    else {
      this = ToPayload(TVar3);
    }
    TVar3 = (rhs->super_MapFieldBaseForParse).payload_._M_i;
    if ((TVar3 & 1) == 0) {
      other = (ReflectionPayload *)0x0;
    }
    else {
      other = ToPayload(TVar3);
    }
    if (this != (ReflectionPayload *)0x0 || other != (ReflectionPayload *)0x0) {
      if (this == (ReflectionPayload *)0x0) {
        this = payload(lhs);
      }
      if (other == (ReflectionPayload *)0x0) {
        other = payload(rhs);
      }
      if (this != other) {
        if ((this->repeated_field).super_RepeatedPtrFieldBase.arena_ ==
            (other->repeated_field).super_RepeatedPtrFieldBase.arena_) {
          lVar6 = 0;
          do {
            uVar1 = *(undefined1 *)
                     ((long)&(this->repeated_field).super_RepeatedPtrFieldBase.tagged_rep_or_elem_ +
                     lVar6);
            *(undefined1 *)
             ((long)&(this->repeated_field).super_RepeatedPtrFieldBase.tagged_rep_or_elem_ + lVar6)
                 = *(undefined1 *)
                    ((long)&(other->repeated_field).super_RepeatedPtrFieldBase.tagged_rep_or_elem_ +
                    lVar6);
            *(undefined1 *)
             ((long)&(other->repeated_field).super_RepeatedPtrFieldBase.tagged_rep_or_elem_ + lVar6)
                 = uVar1;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0x10);
        }
        else {
          RepeatedPtrFieldBase::
          SwapFallback<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                    ((RepeatedPtrFieldBase *)this,(RepeatedPtrFieldBase *)other);
        }
      }
      SVar2 = (other->state)._M_i;
      (other->state)._M_i = (this->state)._M_i;
      (this->state)._M_i = SVar2;
    }
  }
  return;
}

Assistant:

void MapFieldBase::SwapPayload(MapFieldBase& lhs, MapFieldBase& rhs) {
  if (lhs.arena() == rhs.arena()) {
    SwapRelaxed(lhs.payload_, rhs.payload_);
    return;
  }
  auto* p1 = lhs.maybe_payload();
  auto* p2 = rhs.maybe_payload();
  if (p1 == nullptr && p2 == nullptr) return;

  if (p1 == nullptr) p1 = &lhs.payload();
  if (p2 == nullptr) p2 = &rhs.payload();
  p1->repeated_field.Swap(&p2->repeated_field);
  SwapRelaxed(p1->state, p2->state);
}